

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_file.c
# Opt level: O2

err_t cmdFilePrefixRead(octet *prefix,size_t *count,char *name,size_t offset)

{
  bool_t bVar1;
  file_t file;
  size_t sVar2;
  octet *der;
  size_t sVar3;
  size_t sVar4;
  err_t eVar5;
  ulong uVar6;
  size_t len;
  u32 tag;
  
  file = fileOpen(name,"rb");
  if (file == (file_t)0x0) {
    return 0xcb;
  }
  sVar2 = fileSize(file);
  if (sVar2 == 0xffffffffffffffff) {
    eVar5 = 0xcf;
  }
  else {
    eVar5 = 0xd1;
    uVar6 = sVar2 - offset;
    if (offset <= sVar2 && uVar6 != 0) {
      der = (octet *)blobCreate(0x10);
      if (der != (octet *)0x0) {
        sVar4 = 0x10;
        if (uVar6 < 0x10) {
          sVar4 = uVar6;
        }
        bVar1 = fileSeek(file,offset,0);
        if ((bVar1 == 0) || (sVar3 = fileRead2(der,sVar4,file), sVar3 != sVar4)) {
LAB_001045b5:
          blobClose(der);
          fileClose(file);
          return 0xcf;
        }
        sVar4 = derTLDec(&tag,&len,der,sVar4);
        if ((sVar4 == 0xffffffffffffffff) || (sVar2 < sVar4 + offset + len)) {
          blobClose(der);
          fileClose(file);
        }
        else {
          uVar6 = len + sVar4;
          blobClose(der);
          der = (octet *)blobCreate(uVar6);
          if (der == (octet *)0x0) goto LAB_0010463e;
          bVar1 = fileSeek(file,offset,0);
          if ((bVar1 == 0) || (sVar2 = fileRead2(der,uVar6,file), sVar2 != uVar6))
          goto LAB_001045b5;
          bVar1 = fileClose(file);
          if (bVar1 == 0) {
            blobClose(der);
            return 0x67;
          }
          bVar1 = derIsValid3(der,uVar6);
          if (bVar1 != 0) {
            eVar5 = 0;
            if (prefix != (octet *)0x0) {
              if (*count < uVar6) {
                eVar5 = 0x6e;
              }
              else {
                memCopy(prefix,der,uVar6);
              }
            }
            *count = uVar6;
            blobClose(der);
            return eVar5;
          }
          blobClose(der);
        }
        return 0x132;
      }
LAB_0010463e:
      fileClose(file);
      return 0x6e;
    }
  }
  fileClose(file);
  return eVar5;
}

Assistant:

err_t cmdFilePrefixRead(octet* prefix, size_t* count, const char* name,
	size_t offset)
{
	const size_t buf_size = 16;
	err_t code;
	file_t file;
	size_t size;
	void* buf;
	size_t c;
	u32 tag;
	size_t len;
	// pre
	ASSERT(strIsValid(name));
	ASSERT(memIsValid(count, O_PER_S));
	// открыть файл
	code = cmdFileOpen(file, name, "rb");
	ERR_CALL_CHECK(code);
	// определить размер файла
	if ((size = fileSize(file)) == SIZE_MAX)
		code = ERR_FILE_READ;
	else if (offset >= size)
		code = ERR_FILE_SIZE;
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// подготовить память
	code = cmdBlobCreate(buf, buf_size);
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// прочитать заголовок префикса
	c = MIN2(buf_size, size - offset);
	if (!fileSeek(file, offset, SEEK_SET) ||
		fileRead2(buf, c, file) != c)
		code = ERR_FILE_READ;
	ERR_CALL_HANDLE(code, (cmdBlobClose(buf), cmdFileClose(file)));
	// определить длину префикса
	c = derTLDec(&tag, &len, buf, c);
	if (c == SIZE_MAX || offset + c + len > size)
		code = ERR_BAD_FORMAT;
	ERR_CALL_HANDLE(code, (cmdBlobClose(buf), cmdFileClose(file)));
	c += len;
	// прочитать префикс
	cmdBlobClose(buf);
	code = cmdBlobCreate(buf, c);
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	if (!fileSeek(file, offset, SEEK_SET) ||
		fileRead2(buf, c, file) != c)
		code = ERR_FILE_READ;
	ERR_CALL_HANDLE(code, (cmdBlobClose(buf), cmdFileClose(file)));
	// закрыть файл
	code = cmdFileClose(file);
	ERR_CALL_HANDLE(code, cmdBlobClose(buf));
	// проверить префикс
	if (!derIsValid3(buf, c))
		code = ERR_BAD_FORMAT;
	ERR_CALL_HANDLE(code, cmdBlobClose(buf));
	// возвратить префикс и его длину
	if (prefix)
	{
		ASSERT(memIsValid(prefix, *count));
		if (*count < c)
			code = ERR_OUTOFMEMORY;
		else
			memCopy(prefix, buf, c);
	}
	*count = c;
	// завершить
	cmdBlobClose(buf);
	return code;
}